

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

ssize_t zt_cstr_rfind(char *s,ssize_t i,ssize_t j,char *str)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  sVar3 = strlen(s);
  if (sVar3 == 0) {
    lVar5 = 0;
    lVar6 = 0;
  }
  else {
    if (i < 0) {
      lVar4 = sVar3 - 1;
      if ((long)(i + sVar3) < (long)sVar3) {
        lVar4 = i + sVar3;
      }
    }
    else {
      lVar4 = sVar3 - 1;
      if (i < (long)sVar3) {
        lVar4 = i;
      }
    }
    if (j < 0) {
      lVar6 = sVar3 - 1;
      if ((long)(j + sVar3) < (long)sVar3) {
        lVar6 = j + sVar3;
      }
    }
    else {
      lVar6 = sVar3 - 1;
      if (j < (long)sVar3) {
        lVar6 = j;
      }
    }
    lVar5 = lVar6;
    if (lVar6 < lVar4) {
      lVar5 = lVar4;
    }
    if (lVar4 < lVar6) {
      lVar6 = lVar4;
    }
  }
  sVar3 = strlen(str);
  if (sVar3 != 0) {
    lVar4 = lVar5;
    if ((sVar3 == 1) && (lVar6 <= lVar5)) {
      lVar4 = lVar6 + -1;
      do {
        if (s[lVar5] == *str) {
          return lVar5;
        }
        bVar1 = lVar6 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar1);
    }
    lVar5 = (lVar4 - sVar3) + 1;
    if (lVar6 <= lVar5) {
      do {
        iVar2 = strncmp(s + lVar5,str,sVar3);
        if (iVar2 == 0) {
          return lVar5;
        }
        bVar1 = lVar6 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar1);
    }
  }
  return -1;
}

Assistant:

ssize_t
zt_cstr_rfind(const char *s, ssize_t i, ssize_t j, const char *str) {
    size_t    len;
    ssize_t   offt;

    zt_assert(str);

    CONVERT(s, i, j);
    len = strlen(str);

    if (len == 0) {
        return -1;
    }

    if (len == 1) {
        for (; j >= i; j--) {
            if (s[j] == *str) {
                return j;
            }
        }
    }

    for (offt = j - len + 1; offt >= i; offt--) {
        if (strncmp(&s[offt], str, len) == 0) {
            return offt;
        }
    }

    return -1;
}